

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

void __thiscall XPMP2::SoundSystemXP::Unpause(SoundSystemXP *this,uint64_t sndId)

{
  FMOD_RESULT _r;
  SoundChannel *pSVar1;
  int iVar2;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  FmodError local_68;
  
  pSVar1 = SoundSystem::GetChn(&this->super_SoundSystem,sndId);
  if (((pSVar1 != (SoundChannel *)0x0) && (pSVar1->pChn != (FMOD_CHANNEL *)0x0)) &&
     (0 < pSVar1->nPauseCountdown)) {
    iVar2 = pSVar1->nPauseCountdown + -1;
    pSVar1->nPauseCountdown = iVar2;
    if (iVar2 == 0) {
      gFmodRes = FMOD_Channel_SetPaused(pSVar1->pChn,0);
      if (gFmodRes != FMOD_OK) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"FMOD_Channel_SetPaused(pChn->pChn, false)",&local_c9);
        _r = gFmodRes;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                   ,&local_ca);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Unpause",&local_cb);
        FmodError::FmodError(&local_68,&local_88,_r,&local_a8,0x227,&local_c8);
        FmodError::LogErr(&local_68);
        FmodError::~FmodError(&local_68);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
  }
  return;
}

Assistant:

void SoundSystemXP::Unpause ([[maybe_unused]] uint64_t sndId)
{
#if INCLUDE_FMOD_SOUND + 0 >= 1
    SoundChannel* pChn = GetChn(sndId);
    if (!pChn || !pChn->pChn) return;

    if (pChn->ShallUnpause()) {
        FMOD_LOG(FMOD_Channel_SetPaused(pChn->pChn, false));
    }
#endif
}